

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

DirectionCone *
pbrt::BoundSubtendedDirections(DirectionCone *__return_storage_ptr__,Bounds3f *b,Point3f p)

{
  Point3<float> *p2;
  Point3<float> *p2_00;
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar4;
  undefined1 auVar3 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vector3<float> VVar7;
  Vector3f w;
  Float radius;
  float local_6c;
  Point3<float> local_68;
  Point3<float> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  Tuple3<pbrt::Vector3,_float> local_30;
  
  local_58.super_Tuple3<pbrt::Point3,_float>.z = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._8_56_ = p._8_56_;
  auVar3._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  local_68.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_68.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_68.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_58.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar3._0_16_);
  Bounds3<float>::BoundingSphere(b,&local_68,&local_6c);
  fVar1 = DistanceSquared<float>((pbrt *)&local_58,&local_68,p2);
  if (local_6c * local_6c <= fVar1) {
    auVar2._8_8_ = 0;
    auVar2._0_4_ = local_68.super_Tuple3<pbrt::Point3,_float>.x;
    auVar2._4_4_ = local_68.super_Tuple3<pbrt::Point3,_float>.y;
    auVar5._8_8_ = 0;
    auVar5._0_4_ = local_58.super_Tuple3<pbrt::Point3,_float>.x;
    auVar5._4_4_ = local_58.super_Tuple3<pbrt::Point3,_float>.y;
    auVar2 = vsubps_avx(auVar2,auVar5);
    uVar4 = auVar2._8_8_;
    local_30.z = local_68.super_Tuple3<pbrt::Point3,_float>.z -
                 local_58.super_Tuple3<pbrt::Point3,_float>.z;
    local_30._0_8_ = vmovlps_avx(auVar2);
    VVar7 = Normalize<float>((Vector3<float> *)&local_30);
    w.super_Tuple3<pbrt::Vector3,_float>.z = VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
    local_48 = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    uStack_40 = uVar4;
    fVar1 = DistanceSquared<float>((pbrt *)&local_68,&local_58,p2_00);
    auVar6._0_12_ = ZEXT812(0);
    auVar6._12_4_ = 0;
    auVar2 = vmaxss_avx(ZEXT416((uint)(1.0 - (local_6c * local_6c) / fVar1)),auVar6);
    auVar2 = vsqrtss_avx(auVar2,auVar2);
    w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_48;
    w.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_48._4_4_;
    DirectionCone::DirectionCone(__return_storage_ptr__,w,auVar2._0_4_);
  }
  else {
    DirectionCone::EntireSphere();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundSubtendedDirections(const Bounds3f &b, Point3f p) {
    // Compute bounding sphere for _b_ and check if _p_ is inside
    Float radius;
    Point3f pCenter;
    b.BoundingSphere(&pCenter, &radius);
    if (DistanceSquared(p, pCenter) < radius * radius)
        return DirectionCone::EntireSphere();

    // Compute and return _DirectionCone_ for bounding sphere
    Vector3f w = Normalize(pCenter - p);
    Float sin2ThetaMax = Sqr(radius) / DistanceSquared(pCenter, p);
    Float cosThetaMax = SafeSqrt(1 - sin2ThetaMax);
    return DirectionCone(w, cosThetaMax);
}